

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForStatement.h
# Opt level: O2

void __thiscall ForStatement::execute(ForStatement *this,Environment *env)

{
  element_type *peVar1;
  element_type *peVar2;
  RuntimeException *this_00;
  shared_ptr<Iterable> sVar3;
  Iterator iterator;
  __shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2> local_b8;
  ptr<Value> newValue;
  ptr<ValueList> local_98;
  ptr<Iterable> iterable;
  ptr<Value> expressionResult;
  Environment local;
  
  peVar1 = (this->expression).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (**peVar1->_vptr_Expression)(&expressionResult,peVar1,env);
  sVar3 = std::dynamic_pointer_cast<Iterable,Value>((shared_ptr<Value> *)&iterable);
  if (iterable.super___shared_ptr<Iterable,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    (**(iterable.super___shared_ptr<Iterable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Iterable)
              (&local_98);
    Iterator::Iterator(&iterator,&local_98);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_98.
                super___shared_ptr<std::vector<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    while ((ulong)iterator.position <
           (ulong)((long)((iterator.values.
                           super___shared_ptr<std::vector<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->
                         super__Vector_base<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)((iterator.values.
                           super___shared_ptr<std::vector<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->
                         super__Vector_base<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 4)) {
      Environment::Environment(&local,env);
      Iterator::next((Iterator *)&newValue);
      std::__shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_b8,(__shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2> *)&newValue);
      Environment::putValue(&local,&this->ident,Public,(ptr<Value> *)&local_b8,false);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
      peVar2 = (this->statementBlock).super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      (**(peVar2->super_Statement)._vptr_Statement)
                (peVar2,(_Hashtable<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Member>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Member>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_SymbolHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)&local);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&newValue.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::
      _Hashtable<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Member>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Member>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_SymbolHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<Symbol,_std::pair<const_Symbol,_std::shared_ptr<Member>_>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Member>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_SymbolHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&local);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&iterator.values.
                super___shared_ptr<std::vector<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&iterable.super___shared_ptr<Iterable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&expressionResult.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    return;
  }
  this_00 = (RuntimeException *)
            __cxa_allocate_exception
                      (0x10,0,sVar3.super___shared_ptr<Iterable,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi._M_pi);
  RuntimeException::RuntimeException(this_00,"Given value is not an iterable");
  __cxa_throw(this_00,&RuntimeException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void execute(Environment *env) override {
        ptr<Value> expressionResult = expression->evaluate(env);
        ptr<Iterable> iterable = std::dynamic_pointer_cast<Iterable>(expressionResult);

        if(!iterable)
            throw RuntimeException("Given value is not an iterable");

        Iterator iterator(iterable -> getValues());

        while(iterator.hasNext()) {
            try {
                Environment local = *env;
                ptr<Value> newValue = iterator.next();
                local.putValue(ident, Scope::Public, newValue, false);
                statementBlock -> execute(&local);
            } catch (BreakPacket&) {
                break;
            } catch (ContinuePacket&) { }
        }
    }